

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O0

void __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::ExtWrenchesAndJointTorquesEstimator
          (ExtWrenchesAndJointTorquesEstimator *this)

{
  Model *in_RDI;
  estimateExternalWrenchesBuffers *this_00;
  
  iDynTree::Model::Model(in_RDI);
  iDynTree::SubModelDecomposition::SubModelDecomposition((SubModelDecomposition *)(in_RDI + 0x130));
  in_RDI[0x160] = (Model)0x0;
  in_RDI[0x161] = (Model)0x0;
  iDynTree::Traversal::Traversal((Traversal *)(in_RDI + 0x168));
  iDynTree::LinkTraversalsCache::LinkTraversalsCache((LinkTraversalsCache *)(in_RDI + 0x1c8));
  iDynTree::JointPosDoubleArray::JointPosDoubleArray((JointPosDoubleArray *)(in_RDI + 0x1e0),0);
  this_00 = (estimateExternalWrenchesBuffers *)(in_RDI + 0x200);
  iDynTree::JointDOFsDoubleArray::JointDOFsDoubleArray((JointDOFsDoubleArray *)this_00,0);
  iDynTree::JointDOFsDoubleArray::JointDOFsDoubleArray((JointDOFsDoubleArray *)(in_RDI + 0x220),0);
  iDynTree::LinkVelArray::LinkVelArray((LinkVelArray *)(in_RDI + 0x240),0);
  iDynTree::LinkAccArray::LinkAccArray((LinkAccArray *)(in_RDI + 600),0);
  iDynTree::LinkWrenches::LinkWrenches((LinkWrenches *)(in_RDI + 0x270),0);
  iDynTree::LinkWrenches::LinkWrenches((LinkWrenches *)(in_RDI + 0x288),0);
  iDynTree::FreeFloatingGeneralizedTorques::FreeFloatingGeneralizedTorques
            ((FreeFloatingGeneralizedTorques *)(in_RDI + 0x2a0));
  estimateExternalWrenchesBuffers::estimateExternalWrenchesBuffers(this_00);
  estimateExternalWrenchesBuffers::estimateExternalWrenchesBuffers(this_00);
  return;
}

Assistant:

ExtWrenchesAndJointTorquesEstimator::ExtWrenchesAndJointTorquesEstimator():
    m_model(),
    m_submodels(),
    m_isModelValid(false),
    m_isKinematicsUpdated(false),
    m_dynamicTraversal(),
    m_kinematicTraversals(),
    m_jointPos(),
    m_jointVel(),
    m_jointAcc(),
    m_linkVels(),
    m_linkProperAccs(),
    m_linkNetExternalWrenches(),
    m_linkIntWrenches(),
    m_generalizedTorques(),
    m_calibBufs(),
    m_bufs()
{

}